

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.cpp
# Opt level: O2

void * __thiscall ResString::getFieldPtr(ResString *this,size_t fId,size_t subField)

{
  Executable *pEVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  
  if (fId == 1) {
    if (this->sizePtr == (ushort *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*this->sizePtr;
    }
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    UNRECOVERED_JUMPTABLE = (pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar1,this->offset,1,uVar3,0,UNRECOVERED_JUMPTABLE);
    return (void *)CONCAT44(extraout_var_00,iVar2);
  }
  if (fId == 0) {
    return this->sizePtr;
  }
  iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  return (void *)CONCAT44(extraout_var,iVar2);
}

Assistant:

void* ResString::getFieldPtr(size_t fId, size_t subField)
{
    switch (fId) {
        case STR_LEN: return this->sizePtr;
        case WSTRING:
        {
            bufsize_t size = (sizePtr == NULL) ? 0 : static_cast<bufsize_t>(*sizePtr);
            WORD *content = (WORD*) this->m_Exe->getContentAt(offset,Executable::RAW, size);
            return content;
        }
    }
    return this->getPtr();
}